

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeTableCopy
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name *destTable,Name *srcTable)

{
  __index_type *__return_storage_ptr___00;
  string_view destTable_00;
  Name *pNVar1;
  bool bVar2;
  Result<wasm::Ok> local_168;
  Err local_140;
  Err *local_120;
  Err *err_1;
  Result<wasm::Name> _val_1;
  Result<wasm::Name> src;
  Err local_c0;
  Err *local_a0;
  Err *err;
  undefined1 local_88 [8];
  Result<wasm::Name> _val;
  Result<wasm::Name> dest;
  Name *srcTable_local;
  Name *destTable_local;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
  *annotations_local;
  Index pos_local;
  ParseDefsCtx *this_local;
  
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20);
  getTable((Result<wasm::Name> *)__return_storage_ptr___00,this,pos,destTable);
  Result<wasm::Name>::Result
            ((Result<wasm::Name> *)local_88,(Result<wasm::Name> *)__return_storage_ptr___00);
  local_a0 = Result<wasm::Name>::getErr((Result<wasm::Name> *)local_88);
  bVar2 = local_a0 == (Err *)0x0;
  if (!bVar2) {
    wasm::Err::Err(&local_c0,local_a0);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c0);
    wasm::Err::~Err(&local_c0);
  }
  Result<wasm::Name>::~Result((Result<wasm::Name> *)local_88);
  if (bVar2) {
    getTable((Result<wasm::Name> *)
             ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),this,pos,srcTable);
    Result<wasm::Name>::Result
              ((Result<wasm::Name> *)&err_1,
               (Result<wasm::Name> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    local_120 = Result<wasm::Name>::getErr((Result<wasm::Name> *)&err_1);
    bVar2 = local_120 == (Err *)0x0;
    if (!bVar2) {
      wasm::Err::Err(&local_140,local_120);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_140);
      wasm::Err::~Err(&local_140);
    }
    Result<wasm::Name>::~Result((Result<wasm::Name> *)&err_1);
    if (bVar2) {
      pNVar1 = Result<wasm::Name>::operator*
                         ((Result<wasm::Name> *)
                          ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      destTable_00 = (pNVar1->super_IString).str;
      pNVar1 = Result<wasm::Name>::operator*
                         ((Result<wasm::Name> *)
                          ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
      IRBuilder::makeTableCopy
                (&local_168,&this->irBuilder,(Name)destTable_00,(Name)(pNVar1->super_IString).str);
      withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,&local_168);
      Result<wasm::Ok>::~Result(&local_168);
    }
    Result<wasm::Name>::~Result
              ((Result<wasm::Name> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  }
  Result<wasm::Name>::~Result
            ((Result<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

Result<> makeTableCopy(Index pos,
                         const std::vector<Annotation>& annotations,
                         Name* destTable,
                         Name* srcTable) {
    auto dest = getTable(pos, destTable);
    CHECK_ERR(dest);
    auto src = getTable(pos, srcTable);
    CHECK_ERR(src);
    return withLoc(pos, irBuilder.makeTableCopy(*dest, *src));
  }